

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void legendre_poly_coef(int n,double *c)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  
  if (-1 < n) {
    uVar2 = (ulong)(uint)n;
    lVar1 = uVar2 + 1;
    lVar6 = 0;
    lVar9 = lVar1;
    pdVar4 = c;
    pdVar8 = c;
    do {
      do {
        *pdVar4 = 0.0;
        lVar9 = lVar9 + -1;
        pdVar4 = pdVar4 + uVar2 + 1;
      } while (lVar9 != 0);
      lVar6 = lVar6 + 1;
      pdVar4 = pdVar8 + 1;
      lVar9 = lVar1;
      pdVar8 = pdVar4;
    } while (lVar6 != lVar1);
    *c = 1.0;
    if ((n != 0) && (c[uVar2 + 2] = 1.0, 1 < n)) {
      iVar3 = (int)lVar1;
      pdVar4 = c + 2;
      lVar9 = 1;
      lVar6 = 2;
      do {
        iVar5 = (int)lVar6;
        lVar7 = lVar9;
        pdVar8 = pdVar4;
        do {
          *pdVar8 = (pdVar8[-2] * (double)(1 - iVar5)) / (double)iVar5;
          pdVar8 = pdVar8 + iVar3;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        lVar7 = lVar6;
        pdVar8 = pdVar4;
        do {
          pdVar8[iVar3] = (pdVar8[-1] * (double)(iVar5 * 2 + -1)) / (double)iVar5 + pdVar8[iVar3];
          pdVar8 = pdVar8 + iVar3;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        lVar6 = lVar6 + 1;
        lVar9 = lVar9 + 1;
        pdVar4 = pdVar4 + 1;
      } while (lVar6 != lVar1);
    }
  }
  return;
}

Assistant:

void legendre_poly_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_POLY_COEF evaluates the Legendre polynomial coefficients.
//
//  First terms:
//
//     1
//     0     1
//    -1/2   0      3/2
//     0    -3/2    0     5/2
//     3/8   0    -30/8   0     35/8
//     0    15/8    0   -70/8    0     63/8
//    -5/16  0    105/16  0   -315/16   0    231/16
//     0   -35/16   0   315/16   0   -693/16   0    429/16
//
//     1.00000
//     0.00000  1.00000
//    -0.50000  0.00000  1.50000
//     0.00000 -1.50000  0.00000  2.5000
//     0.37500  0.00000 -3.75000  0.00000  4.37500
//     0.00000  1.87500  0.00000 -8.75000  0.00000  7.87500
//    -0.31250  0.00000  6.56250  0.00000 -19.6875  0.00000  14.4375
//     0.00000 -2.1875   0.00000  19.6875  0.00000 -43.3215  0.00000  26.8125
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to evaluate.
//    Note that polynomials 0 through N will be evaluated.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Legendre polynomials
//    of degree 0 through N.  Each polynomial is stored as a row.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n <= 0 )
  {
    return;
  }

  c[1+1*(n+1)] = 1.0;

  for ( i = 2; i <= n; i++ )
  {
    for ( j = 0; j <= i-2; j++ )
    {
      c[i+j*(n+1)] =          
          double(   - i + 1 ) * c[i-2+j*(n+1)] / double(i);
    }
    for ( j = 1; j <= i; j++ )
    {
      c[i+j*(n+1)] = c[i+j*(n+1)] 
        + double( i + i - 1 ) * c[i-1+(j-1)*(n+1)] / double(i);
    }
  }

  return;
}